

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

String * __thiscall asl::String::trim(String *this)

{
  size_t __n;
  byte bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  anon_union_16_2_78e7fdac_for_String_2 *__dest;
  
  uVar2 = this->_len;
  uVar4 = (ulong)(int)uVar2;
  if (this->_size == 0) {
    __dest = &this->field_2;
  }
  else {
    __dest = (anon_union_16_2_78e7fdac_for_String_2 *)(this->field_2)._str;
  }
  uVar5 = 0;
  if (0 < (long)uVar4) {
    do {
      bVar1 = __dest->_space[uVar5];
      if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
         ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
        if ((int)uVar2 <= (int)uVar5) goto LAB_0011a9a2;
        iVar3 = (int)uVar5 + -1;
        goto LAB_0011a97d;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
    uVar5 = (ulong)uVar2;
  }
LAB_0011a9a2:
  iVar3 = uVar2 - 1;
  goto LAB_0011a9a4;
  while (uVar4 = uVar4 - 1, (long)uVar5 < (long)uVar4) {
LAB_0011a97d:
    bVar1 = __dest->_space[uVar4 - 1];
    if (((' ' < (char)bVar1) || (0x20 < bVar1)) ||
       ((0x100002600U >> ((ulong)(uint)bVar1 & 0x3f) & 1) == 0)) {
      iVar3 = (int)uVar4 + -1;
      break;
    }
  }
LAB_0011a9a4:
  lVar6 = (long)(iVar3 - (int)uVar5);
  __n = lVar6 + 1;
  memmove(__dest,(char *)((uVar5 & 0xffffffff) + (long)__dest),__n);
  __dest->_space[lVar6 + 1] = '\0';
  this->_len = (int)__n;
  return this;
}

Assistant:

String& String::trim()
{
	int i, j, n = _len;
	char* s = str();
	for (i = 0; i<n; i++)
		if (!myisspace(s[i])) break;
	for (j = n - 1; j >= i; j--)
		if (!myisspace(s[j])) break;
	memmove(s, s + i, j - i + 1);
	s[j - i + 1] = '\0';
	_len = j - i + 1;
	return *this;
}